

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_unmap_mesh.cpp
# Opt level: O3

void Omega_h::unmap_parents
               (Mesh *old_mesh,Mesh *new_mesh,LOs *new_ents2old_ents_a,
               Few<Omega_h::Read<int>,_4> *old_ents2new_ents)

{
  Alloc *pAVar1;
  int *piVar2;
  int iVar3;
  Mesh *this;
  void *pvVar4;
  Alloc *pAVar5;
  void *pvVar6;
  byte bVar7;
  uint uVar8;
  ulong **__dest;
  long *plVar9;
  long lVar10;
  ulong *puVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  LO size_in;
  size_t sVar15;
  pointer pcVar16;
  bool bVar17;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> new_parent_code;
  Write<int> new_parent_idx;
  Parents old_parents;
  LOs new_ents2old_ents;
  type functor;
  ScopedTimer local_2c9;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8 [2];
  ulong local_2a8;
  Write<signed_char> local_2a0;
  Write<int> local_290;
  ulong **local_280;
  ulong *local_278;
  ulong *local_270 [2];
  ulong *local_260;
  long local_258;
  ulong local_250;
  long lStack_248;
  Alloc *local_240;
  void *local_238;
  Write<signed_char> local_230;
  Write<int> local_220;
  undefined1 local_210 [32];
  Alloc *local_1f0;
  void *local_1e8;
  Alloc *local_1e0;
  void *local_1d8;
  ulong auStack_1d0 [8];
  Alloc *local_190;
  void *local_188;
  Mesh *local_180;
  LOs *local_178;
  Mesh *local_170;
  Alloc *local_168;
  Alloc *local_160;
  Alloc *local_158;
  Alloc *local_150;
  void *local_148;
  void *local_140;
  Read<signed_char> local_138;
  Parents local_128;
  Alloc *local_108;
  void *local_100;
  Alloc *local_f8;
  void *pvStack_f0;
  Alloc *local_e8;
  void *pvStack_e0;
  Alloc *local_d8;
  void *pvStack_d0;
  Alloc *local_c8;
  void *pvStack_c0;
  ulong local_b8 [8];
  Alloc *local_78;
  void *pvStack_70;
  Read<signed_char> local_60;
  Parents local_50;
  
  uVar8 = new_mesh->dim_;
  local_170 = old_mesh;
  if (uVar8 < 4) {
    uVar14 = 1;
    local_180 = new_mesh;
    local_178 = new_ents2old_ents_a;
    do {
      pcVar16 = local_210 + 0x10;
      if (uVar8 < uVar14) {
        return;
      }
      local_108 = new_ents2old_ents_a[uVar14].write_.shared_alloc_.alloc;
      if (((ulong)local_108 & 7) == 0 && local_108 != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_108 = (Alloc *)(local_108->size * 8 + 1);
        }
        else {
          local_108->use_count = local_108->use_count + 1;
        }
      }
      pAVar5 = local_108;
      local_238 = new_ents2old_ents_a[uVar14].write_.shared_alloc_.direct_ptr;
      if (((ulong)local_108 & 1) == 0) {
        sVar15 = local_108->size;
      }
      else {
        sVar15 = (ulong)local_108 >> 3;
      }
      local_2a8 = uVar14;
      local_210._0_8_ = pcVar16;
      local_100 = local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"parent idx","");
      size_in = (LO)(sVar15 >> 2);
      Write<int>::Write(&local_290,size_in,-1,(string *)local_210);
      if ((pointer)local_210._0_8_ != pcVar16) {
        operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
      }
      local_210._0_8_ = pcVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"parent code","");
      Write<signed_char>::Write(&local_2a0,size_in,'\0',(string *)local_210);
      if ((pointer)local_210._0_8_ != pcVar16) {
        operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
      }
      Mesh::ask_parents(&local_128,local_170,(Int)local_2a8);
      pvVar4 = local_128.parent_idx.write_.shared_alloc_.direct_ptr;
      bVar7 = entering_parallel;
      bVar17 = ((ulong)pAVar5 & 7) == 0;
      local_f8 = pAVar5;
      if (bVar17 && pAVar5 != (Alloc *)0x0) {
        if ((entering_parallel & 1) == 0) {
          pAVar5->use_count = pAVar5->use_count + 1;
        }
        else {
          local_f8 = (Alloc *)(pAVar5->size * 8 + 1);
        }
      }
      pvStack_f0 = local_238;
      local_e8 = local_128.parent_idx.write_.shared_alloc_.alloc;
      if (((ulong)local_128.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if ((bVar7 & 1) == 0) {
          (local_128.parent_idx.write_.shared_alloc_.alloc)->use_count =
               (local_128.parent_idx.write_.shared_alloc_.alloc)->use_count + 1;
        }
        else {
          local_e8 = (Alloc *)((local_128.parent_idx.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
      }
      pvStack_e0 = local_128.parent_idx.write_.shared_alloc_.direct_ptr;
      local_d8 = local_128.codes.write_.shared_alloc_.alloc;
      if (((ulong)local_128.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if ((bVar7 & 1) == 0) {
          (local_128.codes.write_.shared_alloc_.alloc)->use_count =
               (local_128.codes.write_.shared_alloc_.alloc)->use_count + 1;
        }
        else {
          local_d8 = (Alloc *)((local_128.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
      }
      pvStack_d0 = local_128.codes.write_.shared_alloc_.direct_ptr;
      local_c8 = local_290.shared_alloc_.alloc;
      if (((ulong)local_290.shared_alloc_.alloc & 7) == 0 &&
          local_290.shared_alloc_.alloc != (Alloc *)0x0) {
        if ((bVar7 & 1) == 0) {
          (local_290.shared_alloc_.alloc)->use_count =
               (local_290.shared_alloc_.alloc)->use_count + 1;
          bVar7 = 0;
        }
        else {
          local_c8 = (Alloc *)((local_290.shared_alloc_.alloc)->size * 8 + 1);
          bVar7 = 1;
        }
      }
      pvStack_c0 = local_290.shared_alloc_.direct_ptr;
      lVar10 = 0x48;
      do {
        plVar9 = *(long **)((long)old_ents2new_ents->array_ + lVar10 + -0x48);
        *(long **)((long)&local_100 + lVar10) = plVar9;
        if (((ulong)plVar9 & 7) == 0 && plVar9 != (long *)0x0) {
          if ((bVar7 & 1) == 0) {
            *(int *)(plVar9 + 6) = (int)plVar9[6] + 1;
          }
          else {
            *(long *)((long)&local_100 + lVar10) = *plVar9 * 8 + 1;
          }
        }
        *(undefined8 *)((long)&local_f8 + lVar10) =
             *(undefined8 *)
              ((long)&old_ents2new_ents[-1].array_[0].write_.shared_alloc_.alloc + lVar10);
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x88);
      local_78 = local_2a0.shared_alloc_.alloc;
      if (((ulong)local_2a0.shared_alloc_.alloc & 7) == 0 &&
          local_2a0.shared_alloc_.alloc != (Alloc *)0x0) {
        if ((bVar7 & 1) == 0) {
          (local_2a0.shared_alloc_.alloc)->use_count =
               (local_2a0.shared_alloc_.alloc)->use_count + 1;
        }
        else {
          local_78 = (Alloc *)((local_2a0.shared_alloc_.alloc)->size * 8 + 1);
        }
      }
      local_148 = local_290.shared_alloc_.direct_ptr;
      local_140 = local_128.codes.write_.shared_alloc_.direct_ptr;
      pvStack_70 = local_2a0.shared_alloc_.direct_ptr;
      local_2c8 = (ulong *)0x5d;
      local_280 = local_270;
      local_240 = pAVar5;
      local_168 = local_c8;
      local_160 = local_d8;
      local_158 = local_f8;
      local_150 = local_e8;
      __dest = (ulong **)std::__cxx11::string::_M_create((ulong *)&local_280,(ulong)&local_2c8);
      puVar11 = local_2c8;
      local_270[0] = local_2c8;
      local_280 = __dest;
      memcpy(__dest,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_for.hpp"
             ,0x5d);
      local_278 = puVar11;
      *(undefined1 *)((long)__dest + (long)puVar11) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_280);
      puVar11 = (ulong *)(plVar9 + 2);
      if ((ulong *)*plVar9 == puVar11) {
        local_250 = *puVar11;
        lStack_248 = plVar9[3];
        local_260 = &local_250;
      }
      else {
        local_250 = *puVar11;
        local_260 = (ulong *)*plVar9;
      }
      local_258 = plVar9[1];
      *plVar9 = (long)puVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_2c8 = local_2b8;
      std::__cxx11::string::_M_construct((ulong)&local_2c8,'\x02');
      *(undefined2 *)local_2c8 = 0x3438;
      uVar14 = 0xf;
      if (local_260 != &local_250) {
        uVar14 = local_250;
      }
      if (uVar14 < (ulong)(local_2c0 + local_258)) {
        uVar14 = 0xf;
        if (local_2c8 != local_2b8) {
          uVar14 = local_2b8[0];
        }
        if (uVar14 < (ulong)(local_2c0 + local_258)) goto LAB_00410a97;
        plVar9 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_2c8,0,(char *)0x0,(ulong)local_260);
      }
      else {
LAB_00410a97:
        plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_260,(ulong)local_2c8);
      }
      local_210._0_8_ = local_210 + 0x10;
      pAVar1 = (Alloc *)(plVar9 + 2);
      if ((Alloc *)*plVar9 == pAVar1) {
        local_210._16_8_ = pAVar1->size;
        local_210._24_8_ = plVar9[3];
      }
      else {
        local_210._16_8_ = pAVar1->size;
        local_210._0_8_ = (Alloc *)*plVar9;
      }
      local_210._8_8_ = plVar9[1];
      *plVar9 = (long)pAVar1;
      plVar9[1] = 0;
      *(undefined1 *)&pAVar1->size = 0;
      begin_code("parallel_for",(char *)local_210._0_8_);
      if ((Alloc *)local_210._0_8_ != (Alloc *)(local_210 + 0x10)) {
        operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
      }
      if (local_2c8 != local_2b8) {
        operator_delete(local_2c8,local_2b8[0] + 1);
      }
      if (local_260 != &local_250) {
        operator_delete(local_260,local_250 + 1);
      }
      if (local_280 != local_270) {
        operator_delete(local_280,(long)local_270[0] + 1);
      }
      pvVar6 = pvStack_70;
      if (0 < size_in) {
        local_210._0_8_ = local_158;
        local_210._8_8_ = local_238;
        if (((ulong)local_158 & 7) == 0 && local_158 != (Alloc *)0x0) {
          local_158->use_count = local_158->use_count + -1;
          local_210._0_8_ = local_158->size * 8 + 1;
        }
        local_f8 = (Alloc *)0x0;
        pvStack_f0 = (void *)0x0;
        local_210._16_8_ = local_150;
        local_210._24_8_ = pvVar4;
        if (((ulong)local_150 & 7) == 0 && local_150 != (Alloc *)0x0) {
          local_150->use_count = local_150->use_count + -1;
          local_210._16_8_ = local_150->size * 8 + 1;
        }
        local_e8 = (Alloc *)0x0;
        pvStack_e0 = (void *)0x0;
        local_1f0 = local_160;
        local_1e8 = local_140;
        if (((ulong)local_160 & 7) == 0 && local_160 != (Alloc *)0x0) {
          local_160->use_count = local_160->use_count + -1;
          local_1f0 = (Alloc *)(local_160->size * 8 + 1);
        }
        local_d8 = (Alloc *)0x0;
        pvStack_d0 = (void *)0x0;
        local_1e0 = local_168;
        local_1d8 = local_148;
        if (((ulong)local_168 & 7) == 0 && local_168 != (Alloc *)0x0) {
          local_168->use_count = local_168->use_count + -1;
          local_1e0 = (Alloc *)(local_168->size * 8 + 1);
        }
        local_c8 = (Alloc *)0x0;
        pvStack_c0 = (void *)0x0;
        lVar10 = 0x40;
        do {
          plVar9 = *(long **)((long)&local_f8 + lVar10);
          *(long **)(local_210 + lVar10) = plVar9;
          *(undefined8 *)(local_210 + lVar10 + 8) = *(undefined8 *)((long)&pvStack_f0 + lVar10);
          if (((ulong)plVar9 & 7) == 0 && plVar9 != (long *)0x0) {
            *(int *)(plVar9 + 6) = (int)plVar9[6] + -1;
            *(long *)(local_210 + lVar10) = *plVar9 * 8 + 1;
          }
          *(undefined8 *)((long)&local_f8 + lVar10) = 0;
          *(undefined8 *)((long)&pvStack_f0 + lVar10) = 0;
          lVar10 = lVar10 + 0x10;
        } while (lVar10 != 0x80);
        local_190 = local_78;
        local_188 = pvStack_70;
        if (((ulong)local_78 & 7) == 0 && local_78 != (Alloc *)0x0) {
          local_78->use_count = local_78->use_count + -1;
          local_190 = (Alloc *)(local_78->size * 8 + 1);
        }
        local_78 = (Alloc *)0x0;
        pvStack_70 = (void *)0x0;
        entering_parallel = 0;
        lVar10 = 0;
        do {
          lVar12 = (long)*(int *)((long)local_238 + lVar10 * 4);
          lVar13 = (long)*(int *)((long)pvVar4 + lVar12 * 4);
          if (-1 < lVar13) {
            bVar7 = *(byte *)((long)local_140 + lVar12);
            iVar3 = *(int *)(*(long *)((long)auStack_1d0 + (ulong)((bVar7 & 3) << 4) + 8) +
                            lVar13 * 4);
            *(int *)((long)local_148 + lVar10 * 4) = iVar3;
            if (-1 < iVar3) {
              *(byte *)((long)pvVar6 + lVar10) = bVar7;
            }
          }
          lVar10 = lVar10 + 1;
        } while (size_in != (int)lVar10);
        unmap_parents(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>*,Omega_h::Few<Omega_h::Read<int>,4>)
        ::$_0::~__0((__0 *)local_210);
      }
      ScopedTimer::~ScopedTimer(&local_2c9);
      new_ents2old_ents_a = local_178;
      this = local_180;
      local_220.shared_alloc_.alloc = local_290.shared_alloc_.alloc;
      if (((ulong)local_290.shared_alloc_.alloc & 7) == 0 &&
          local_290.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_220.shared_alloc_.alloc = (Alloc *)((local_290.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_290.shared_alloc_.alloc)->use_count =
               (local_290.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_220.shared_alloc_.direct_ptr = local_290.shared_alloc_.direct_ptr;
      Read<int>::Read(&local_138,&local_220);
      local_230.shared_alloc_.alloc = local_2a0.shared_alloc_.alloc;
      if (((ulong)local_2a0.shared_alloc_.alloc & 7) == 0 &&
          local_2a0.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == 1) {
          local_230.shared_alloc_.alloc = (Alloc *)((local_2a0.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_2a0.shared_alloc_.alloc)->use_count =
               (local_2a0.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_230.shared_alloc_.direct_ptr = local_2a0.shared_alloc_.direct_ptr;
      Read<signed_char>::Read(&local_60,&local_230);
      Parents::Parents(&local_50,(LOs *)&local_138,&local_60);
      Mesh::set_parents(this,(Int)local_2a8,&local_50);
      pAVar1 = local_50.codes.write_.shared_alloc_.alloc;
      if (((ulong)local_50.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_50.codes.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_50.codes.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_50.parent_idx.write_.shared_alloc_.alloc;
      if (((ulong)local_50.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
          local_50.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_50.parent_idx.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_50.parent_idx.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_60.write_.shared_alloc_.alloc;
      if (((ulong)local_60.write_.shared_alloc_.alloc & 7) == 0 &&
          local_60.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_60.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_60.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_230.shared_alloc_.alloc;
      if (((ulong)local_230.shared_alloc_.alloc & 7) == 0 &&
          local_230.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_230.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_230.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_138.write_.shared_alloc_.alloc;
      if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
          local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_138.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_220.shared_alloc_.alloc;
      if (((ulong)local_220.shared_alloc_.alloc & 7) == 0 &&
          local_220.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_220.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_220.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      unmap_parents(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>*,Omega_h::Few<Omega_h::Read<int>,4>)
      ::$_0::~__0((__0 *)&local_f8);
      pAVar1 = local_128.codes.write_.shared_alloc_.alloc;
      if (((ulong)local_128.codes.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_128.codes.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_128.codes.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_128.parent_idx.write_.shared_alloc_.alloc;
      if (((ulong)local_128.parent_idx.write_.shared_alloc_.alloc & 7) == 0 &&
          local_128.parent_idx.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_128.parent_idx.write_.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_128.parent_idx.write_.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_2a0.shared_alloc_.alloc;
      if (((ulong)local_2a0.shared_alloc_.alloc & 7) == 0 &&
          local_2a0.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_2a0.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_2a0.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_290.shared_alloc_.alloc;
      if (((ulong)local_290.shared_alloc_.alloc & 7) == 0 &&
          local_290.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar2 = &(local_290.shared_alloc_.alloc)->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_290.shared_alloc_.alloc);
          operator_delete(pAVar1,0x48);
        }
      }
      pAVar1 = local_240;
      if (bVar17 && pAVar5 != (Alloc *)0x0) {
        piVar2 = &local_240->use_count;
        *piVar2 = *piVar2 + -1;
        if (*piVar2 == 0) {
          Alloc::~Alloc(local_240);
          operator_delete(pAVar1,0x48);
        }
      }
      uVar14 = local_2a8 + 1;
      uVar8 = this->dim_;
    } while (uVar8 < 4);
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void unmap_parents(Mesh* old_mesh, Mesh* new_mesh,
    LOs new_ents2old_ents_a[], Few<LOs, 4> old_ents2new_ents) {
  for (Int ent_dim = 1; ent_dim <= new_mesh->dim(); ++ent_dim) {
    auto new_ents2old_ents = new_ents2old_ents_a[ent_dim];
    auto nnew_ents = new_ents2old_ents.size();
    Write<LO> new_parent_idx(nnew_ents, -1, "parent idx");
    Write<Byte> new_parent_code(nnew_ents, 0, "parent code");
    auto old_parents = old_mesh->ask_parents(ent_dim);
    auto functor = OMEGA_H_LAMBDA(LO new_ent) {
      auto old_ent = new_ents2old_ents[new_ent];
      auto old_parent_idx = old_parents.parent_idx[old_ent];
      auto old_parent_code = old_parents.codes[old_ent];
      if (old_parent_idx > -1) {
        auto old_parent_dim = amr::code_parent_dim(old_parent_code);
        new_parent_idx[new_ent] =
          old_ents2new_ents[old_parent_dim][old_parent_idx];
        if (new_parent_idx[new_ent] > -1)
          new_parent_code[new_ent] = old_parent_code;
      }
    };
    parallel_for(nnew_ents, std::move(functor));
    new_mesh->set_parents(ent_dim, Parents{new_parent_idx, new_parent_code});
  }
}